

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_box2f(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  int32_t isz;
  exr_attr_box2f_t tmp;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_28 = *(undefined4 *)&a->name;
  uStack_24 = *(undefined4 *)((long)&a->name + 4);
  uStack_20 = *(undefined4 *)&a->type_name;
  uStack_1c = *(undefined4 *)((long)&a->type_name + 4);
  local_2c = 0x10;
  eVar1 = (*ctxt->do_write)(ctxt,&local_2c,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,&local_28,0x10,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_box2f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t     rv;
    exr_attr_box2f_t tmp = *(a->box2f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_box2f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 4);
    return rv;
}